

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

uint32_t mp_sizeof_binl(uint32_t len)

{
  undefined4 local_c;
  uint32_t len_local;
  
  if (len < 0x100) {
    local_c = 2;
  }
  else if (len < 0x10000) {
    local_c = 3;
  }
  else {
    local_c = 5;
  }
  return local_c;
}

Assistant:

MP_IMPL uint32_t
mp_sizeof_binl(uint32_t len)
{
	if (len <= UINT8_MAX) {
		return 1 + sizeof(uint8_t);
	} else if (len <= UINT16_MAX) {
		return 1 + sizeof(uint16_t);
	} else {
		return 1 + sizeof(uint32_t);
	}
}